

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

bool __thiscall
miniros::MasterLink::getNodes
          (MasterLink *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nodes)

{
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  int iVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  bool in_stack_000000d7;
  RpcValue *in_stack_000000d8;
  RpcValue *in_stack_000000e0;
  RpcValue *in_stack_000000e8;
  string name;
  int k;
  RpcValue val;
  int j;
  int i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  node_set;
  RpcValue payload;
  RpcValue result;
  RpcValue args;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  XmlRpcValue *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe30;
  allocator<char> *in_stack_fffffffffffffe40;
  XmlRpcValue *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  const_iterator in_stack_fffffffffffffe68;
  string local_108 [36];
  int local_e4;
  int local_d0;
  int local_cc;
  undefined4 local_98;
  allocator<char> local_91;
  string local_90 [36];
  Error local_6c [5];
  XmlRpcValue local_58 [2];
  XmlRpcValue local_38;
  XmlRpcValue local_28 [2];
  byte local_1;
  
  XmlRpc::XmlRpcValue::XmlRpcValue(local_28);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_38);
  XmlRpc::XmlRpcValue::XmlRpcValue(local_58);
  this_node::getName_abi_cxx11_();
  XmlRpc::XmlRpcValue::XmlRpcValue
            ((XmlRpcValue *)in_stack_fffffffffffffe30._M_node,
             (string *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
  XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48)
  ;
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x459aa5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  local_6c[0] = execute((MasterLink *)name._M_string_length,(string *)name._0_8_,in_stack_000000e8,
                        in_stack_000000e0,in_stack_000000d8,in_stack_000000d7);
  bVar2 = Error::operator_cast_to_bool(local_6c);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x459c51);
    local_cc = 0;
    while( true ) {
      iVar1 = local_cc;
      iVar3 = XmlRpc::XmlRpcValue::size((XmlRpcValue *)in_stack_fffffffffffffe58._M_node);
      if (iVar3 <= iVar1) break;
      local_d0 = 0;
      while( true ) {
        iVar1 = local_d0;
        XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        iVar3 = XmlRpc::XmlRpcValue::size((XmlRpcValue *)in_stack_fffffffffffffe58._M_node);
        if (iVar3 <= iVar1) break;
        XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        in_stack_fffffffffffffe68._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        XmlRpc::XmlRpcValue::XmlRpcValue
                  (in_stack_fffffffffffffe10,
                   (XmlRpcValue *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        local_e4 = 0;
        while( true ) {
          in_stack_fffffffffffffe60 = local_e4;
          in_stack_fffffffffffffe64 =
               XmlRpc::XmlRpcValue::size((XmlRpcValue *)in_stack_fffffffffffffe58._M_node);
          if (in_stack_fffffffffffffe64 <= in_stack_fffffffffffffe60) break;
          in_stack_fffffffffffffe58._M_node =
               (_Base_ptr)
               XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
          in_stack_fffffffffffffe50 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
          XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
          XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
          psVar4 = XmlRpc::XmlRpcValue::operator_cast_to_string_(in_stack_fffffffffffffe10);
          std::__cxx11::string::string(local_108,(string *)psVar4);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffe30._M_node,
                           (value_type *)
                           CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
          in_stack_fffffffffffffe30 = pVar5.first._M_node;
          in_stack_fffffffffffffe2f = pVar5.second;
          std::__cxx11::string::~string(local_108);
          local_e4 = local_e4 + 1;
        }
        XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x459ec3);
        local_d0 = local_d0 + 1;
      }
      local_cc = local_cc + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x459f10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe10,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    __first._M_node._4_4_ = in_stack_fffffffffffffe64;
    __first._M_node._0_4_ = in_stack_fffffffffffffe60;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe68,__first,
               in_stack_fffffffffffffe58);
    local_1 = 1;
    local_98 = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x459fc1);
  }
  else {
    local_1 = 0;
    local_98 = 1;
  }
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x459fdf);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x459fec);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x459ff9);
  return (bool)(local_1 & 1);
}

Assistant:

bool MasterLink::getNodes(std::vector<std::string>& nodes) const
{
  RpcValue args, result, payload;
  args[0] = this_node::getName();

  if (!execute("getSystemState", args, result, payload, true)) {
    return false;
  }

  std::set<std::string> node_set;
  for (int i = 0; i < payload.size(); ++i) {
    for (int j = 0; j < payload[i].size(); ++j) {
      RpcValue val = payload[i][j][1];
      for (int k = 0; k < val.size(); ++k) {
        std::string name = payload[i][j][1][k];
        node_set.insert(name);
      }
    }
  }

  nodes.clear();
  nodes.insert(nodes.end(), node_set.begin(), node_set.end());

  return true;
}